

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

_Bool Curl_ssl_conn_config_match(Curl_easy *data,connectdata *candidate,_Bool proxy)

{
  _Bool _Var1;
  undefined3 in_register_00000011;
  int iVar2;
  undefined4 in_register_00000014;
  Curl_easy *data_00;
  
  iVar2 = CONCAT31(in_register_00000011,proxy);
  data_00 = (Curl_easy *)&(data->set).proxy_ssl;
  if (iVar2 == 0) {
    data_00 = (Curl_easy *)&(data->set).ssl;
  }
  _Var1 = match_ssl_primary_config
                    (data_00,(ssl_primary_config *)
                             ((long)&((ssl_primary_config *)(&candidate->shutdown + 1))->CApath +
                             (ulong)(uint)(iVar2 << 7)),
                     (ssl_primary_config *)CONCAT44(in_register_00000014,iVar2));
  return _Var1;
}

Assistant:

bool Curl_ssl_conn_config_match(struct Curl_easy *data,
                                struct connectdata *candidate,
                                bool proxy)
{
#ifndef CURL_DISABLE_PROXY
  if(proxy)
    return match_ssl_primary_config(data, &data->set.proxy_ssl.primary,
                                    &candidate->proxy_ssl_config);
#else
  (void)proxy;
#endif
  return match_ssl_primary_config(data, &data->set.ssl.primary,
                                  &candidate->ssl_config);
}